

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall Logic_And_Test::TestBody(Logic_And_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_f28;
  Message local_f20;
  int local_f18;
  uint8_t local_f11;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar_50;
  Message local_ef8;
  int local_ef0;
  uint8_t local_ee9;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar_49;
  Message local_ed0;
  int local_ec8;
  uint8_t local_ec1;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar_48;
  Message local_ea8;
  BcOp local_ea0;
  BcOp local_e9c;
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_47;
  undefined1 local_e80 [4];
  BcIns ins_18;
  AssertHelper local_e60;
  Message local_e58;
  bool local_e49;
  undefined1 local_e48 [8];
  AssertionResult gtest_ar__18;
  Message local_e30;
  anon_enum_32 local_e28;
  uint16_t local_e22;
  undefined1 local_e20 [8];
  AssertionResult gtest_ar_46;
  Message local_e08;
  int local_e00;
  uint8_t local_df9;
  undefined1 local_df8 [8];
  AssertionResult gtest_ar_45;
  Message local_de0;
  BcOp local_dd8;
  BcOp local_dd4;
  undefined1 local_dd0 [8];
  AssertionResult gtest_ar_44;
  undefined1 local_db8 [4];
  BcIns ins_17;
  AssertHelper local_d98;
  Message local_d90;
  bool local_d81;
  undefined1 local_d80 [8];
  AssertionResult gtest_ar__17;
  Message local_d68;
  int local_d60;
  uint32_t local_d5c;
  undefined1 local_d58 [8];
  AssertionResult gtest_ar_43;
  Message local_d40;
  BcOp local_d38;
  BcOp local_d34;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar_42;
  undefined1 local_d18 [4];
  BcIns ins_16;
  AssertHelper local_cf8;
  Message local_cf0;
  bool local_ce1;
  undefined1 local_ce0 [8];
  AssertionResult gtest_ar__16;
  Message local_cc8;
  anon_enum_32 local_cc0;
  uint16_t local_cba;
  undefined1 local_cb8 [8];
  AssertionResult gtest_ar_41;
  Message local_ca0;
  int local_c98;
  uint8_t local_c91;
  undefined1 local_c90 [8];
  AssertionResult gtest_ar_40;
  Message local_c78;
  BcOp local_c70;
  BcOp local_c6c;
  undefined1 local_c68 [8];
  AssertionResult gtest_ar_39;
  undefined1 local_c50 [4];
  BcIns ins_15;
  AssertHelper local_c30;
  Message local_c28;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__15;
  Message local_c00;
  int local_bf8;
  uint32_t local_bf4;
  undefined1 local_bf0 [8];
  AssertionResult gtest_ar_38;
  Message local_bd8;
  BcOp local_bd0;
  BcOp local_bcc;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_37;
  undefined1 local_bb0 [4];
  BcIns ins_14;
  AssertHelper local_b90;
  Message local_b88;
  bool local_b79;
  undefined1 local_b78 [8];
  AssertionResult gtest_ar__14;
  Message local_b60;
  int local_b58;
  uint16_t local_b52;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_36;
  Message local_b38;
  int local_b30;
  uint8_t local_b29;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_35;
  Message local_b10;
  BcOp local_b08;
  BcOp local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_34;
  undefined1 local_ae8 [4];
  BcIns ins_13;
  AssertHelper local_ac8;
  Message local_ac0;
  bool local_ab1;
  undefined1 local_ab0 [8];
  AssertionResult gtest_ar__13;
  Message local_a98;
  int local_a90;
  uint32_t local_a8c;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_33;
  Message local_a70;
  BcOp local_a68;
  BcOp local_a64;
  undefined1 local_a60 [8];
  AssertionResult gtest_ar_32;
  undefined1 local_a48 [4];
  BcIns ins_12;
  AssertHelper local_a28;
  Message local_a20;
  bool local_a11;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar__12;
  Message local_9f8;
  int local_9f0;
  uint16_t local_9ea;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_31;
  Message local_9d0;
  int local_9c8;
  uint8_t local_9c1;
  undefined1 local_9c0 [8];
  AssertionResult gtest_ar_30;
  Message local_9a8;
  BcOp local_9a0;
  BcOp local_99c;
  undefined1 local_998 [8];
  AssertionResult gtest_ar_29;
  undefined1 local_980 [4];
  BcIns ins_11;
  AssertHelper local_960;
  Message local_958;
  bool local_949;
  undefined1 local_948 [8];
  AssertionResult gtest_ar__11;
  Message local_930;
  int local_928;
  uint32_t local_924;
  undefined1 local_920 [8];
  AssertionResult gtest_ar_28;
  Message local_908;
  BcOp local_900;
  BcOp local_8fc;
  undefined1 local_8f8 [8];
  AssertionResult gtest_ar_27;
  undefined1 local_8e0 [4];
  BcIns ins_10;
  AssertHelper local_8c0;
  Message local_8b8;
  bool local_8a9;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar__10;
  Message local_890;
  int local_888;
  uint16_t local_882;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_26;
  Message local_868;
  int local_860;
  uint8_t local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_25;
  Message local_840;
  BcOp local_838;
  BcOp local_834;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_24;
  undefined1 local_818 [4];
  BcIns ins_9;
  AssertHelper local_7f8;
  Message local_7f0;
  bool local_7e1;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar__9;
  Message local_7c8;
  anon_enum_32 local_7c0;
  uint16_t local_7ba;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_23;
  Message local_7a0;
  int local_798;
  uint8_t local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_22;
  Message local_778;
  BcOp local_770;
  BcOp local_76c;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_21;
  undefined1 local_750 [4];
  BcIns ins_8;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__8;
  Message local_700;
  int local_6f8;
  uint32_t local_6f4;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_20;
  Message local_6d8;
  BcOp local_6d0;
  BcOp local_6cc;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_19;
  undefined1 local_6b0 [4];
  BcIns ins_7;
  AssertHelper local_690;
  Message local_688;
  bool local_679;
  undefined1 local_678 [8];
  AssertionResult gtest_ar__7;
  Message local_660;
  anon_enum_32 local_658;
  uint16_t local_652;
  undefined1 local_650 [8];
  AssertionResult gtest_ar_18;
  Message local_638;
  int local_630;
  uint8_t local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_17;
  Message local_610;
  BcOp local_608;
  BcOp local_604;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_16;
  undefined1 local_5e8 [4];
  BcIns ins_6;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__6;
  Message local_598;
  int local_590;
  uint32_t local_58c;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_15;
  Message local_570;
  BcOp local_568;
  BcOp local_564;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_14;
  undefined1 local_548 [4];
  BcIns ins_5;
  AssertHelper local_528;
  Message local_520;
  bool local_511;
  undefined1 local_510 [8];
  AssertionResult gtest_ar__5;
  Message local_4f8;
  int local_4f0;
  uint16_t local_4ea;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_13;
  Message local_4d0;
  int local_4c8;
  uint8_t local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_12;
  Message local_4a8;
  BcOp local_4a0;
  BcOp local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_11;
  undefined1 local_480 [4];
  BcIns ins_4;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__4;
  Message local_430;
  int local_428;
  uint32_t local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_10;
  Message local_408;
  BcOp local_400;
  BcOp local_3fc;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_9;
  undefined1 local_3e0 [4];
  BcIns ins_3;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__3;
  Message local_390;
  int local_388;
  uint16_t local_382;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_8;
  Message local_368;
  int local_360;
  uint8_t local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  BcOp local_338;
  BcOp local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_318 [4];
  BcIns ins_2;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__2;
  Message local_2c8;
  int local_2c0;
  uint16_t local_2ba;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  Message local_2a0;
  int local_298;
  uint8_t local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  BcOp local_270;
  BcOp local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_250 [4];
  BcIns ins_1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  Message local_200;
  int local_1f8;
  uint16_t local_1f2;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  int local_1d0;
  uint8_t local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  BcOp local_1a8;
  BcOp local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  BcIns ins;
  AssertHelper local_168;
  Message local_160 [3];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  MockParser mock;
  Logic_And_Test *this_local;
  
  MockParser::MockParser
            ((MockParser *)&gtest_ar_.message_,
             "let a = 3\nlet b = 4\nlet c = a == 3 && b == 4\nlet d = a == 3 && b == 4 && c == 5\n")
  ;
  local_141 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ins,(internal *)local_140,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x192,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&ins);
    testing::Message::~Message(local_160);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_._0_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
    local_1a4 = bc_op((BcIns)gtest_ar.message_.ptr_);
    local_1a8 = BC_SET_N;
    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
              ((EqHelper<false> *)local_1a0,"bc_op(ins)","BC_SET_N",&local_1a4,&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x192,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_1c9 = bc_arg1((BcIns)gtest_ar.message_.ptr_);
      local_1d0 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                ((EqHelper<false> *)local_1c8,"bc_arg1(ins)","0",&local_1c9,&local_1d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x192,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_1f2 = bc_arg16((BcIns)gtest_ar.message_.ptr_);
        local_1f8 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                  ((EqHelper<false> *)local_1f0,"bc_arg16(ins)","0",&local_1f2,&local_1f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x192,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_200);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_200);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_219 = mock.cur_fn <
                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_218,&local_219,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_250,(internal *)local_218,
                       (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x193,pcVar2);
            testing::internal::AssertHelper::operator=(&local_230,&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            std::__cxx11::string::~string((string *)local_250);
            testing::Message::~Message(&local_228);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            gtest_ar_3.message_.ptr_._4_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
            local_26c = bc_op(gtest_ar_3.message_.ptr_._4_4_);
            local_270 = BC_SET_N;
            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                      ((EqHelper<false> *)local_268,"bc_op(ins)","BC_SET_N",&local_26c,&local_270);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x193,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_278);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_278);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_291 = bc_arg1(gtest_ar_3.message_.ptr_._4_4_);
              local_298 = 1;
              testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                        ((EqHelper<false> *)local_290,"bc_arg1(ins)","1",&local_291,&local_298);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
              if (!bVar1) {
                testing::Message::Message(&local_2a0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x193,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2a0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2a0);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_2ba = bc_arg16(gtest_ar_3.message_.ptr_._4_4_);
                local_2c0 = 1;
                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                          ((EqHelper<false> *)local_2b8,"bc_arg16(ins)","1",&local_2ba,&local_2c0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2c8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x193,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2c8);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  local_2e1 = mock.cur_fn <
                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_318,(internal *)local_2e0,
                               (AssertionResult *)
                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true",
                               in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x195,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                    std::__cxx11::string::~string((string *)local_318);
                    testing::Message::~Message(&local_2f0);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar_6.message_.ptr_._4_4_ =
                         MockParser::next((MockParser *)&gtest_ar_.message_);
                    local_334 = bc_op(gtest_ar_6.message_.ptr_._4_4_);
                    local_338 = BC_NEQ_LN;
                    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                              ((EqHelper<false> *)local_330,"bc_op(ins)","BC_NEQ_LN",&local_334,
                               &local_338);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_330);
                    if (!bVar1) {
                      testing::Message::Message(&local_340);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_330);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x195,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_340);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_340);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                      local_359 = bc_arg1(gtest_ar_6.message_.ptr_._4_4_);
                      local_360 = 0;
                      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                ((EqHelper<false> *)local_358,"bc_arg1(ins)","0",&local_359,
                                 &local_360);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_358);
                      if (!bVar1) {
                        testing::Message::Message(&local_368);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_358);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x195,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_8.message_,&local_368);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_8.message_);
                        testing::Message::~Message(&local_368);
                      }
                      gtest_ar.message_.ptr_._5_3_ = 0;
                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                        local_382 = bc_arg16(gtest_ar_6.message_.ptr_._4_4_);
                        local_388 = 0;
                        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                  ((EqHelper<false> *)local_380,"bc_arg16(ins)","0",&local_382,
                                   &local_388);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_380);
                        if (!bVar1) {
                          testing::Message::Message(&local_390);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_380);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x195,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar__3.message_,&local_390);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar__3.message_);
                          testing::Message::~Message(&local_390);
                        }
                        gtest_ar.message_.ptr_._5_3_ = 0;
                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                          local_3a9 = mock.cur_fn <
                                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                           mock.vm._264_8_ * 0x18);
                          testing::AssertionResult::AssertionResult<bool>
                                    ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3a8);
                          if (!bVar1) {
                            testing::Message::Message(&local_3b8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_3e0,(internal *)local_3a8,
                                       (AssertionResult *)
                                       "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                                       "true",in_R9);
                            pcVar2 = (char *)std::__cxx11::string::c_str();
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3c0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x196,pcVar2);
                            testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                            testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                            std::__cxx11::string::~string((string *)local_3e0);
                            testing::Message::~Message(&local_3b8);
                          }
                          gtest_ar.message_.ptr_._5_3_ = 0;
                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                            gtest_ar_9.message_.ptr_._4_4_ =
                                 MockParser::next((MockParser *)&gtest_ar_.message_);
                            local_3fc = bc_op(gtest_ar_9.message_.ptr_._4_4_);
                            local_400 = BC_JMP;
                            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                      ((EqHelper<false> *)local_3f8,"bc_op(ins)","BC_JMP",&local_3fc
                                       ,&local_400);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3f8);
                            if (!bVar1) {
                              testing::Message::Message(&local_408);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_3f8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x196,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_10.message_,&local_408);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_);
                              testing::Message::~Message(&local_408);
                            }
                            gtest_ar.message_.ptr_._5_3_ = 0;
                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8)
                            ;
                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                              local_424 = bc_arg24(gtest_ar_9.message_.ptr_._4_4_);
                              local_428 = 0x800004;
                              testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                                        ((EqHelper<false> *)local_420,"bc_arg24(ins)",
                                         "0x800000 + 5 - 1",&local_424,&local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x196,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__4.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__4.message_);
                                testing::Message::~Message(&local_430);
                              }
                              gtest_ar.message_.ptr_._5_3_ = 0;
                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                local_449 = mock.cur_fn <
                                            (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                 mock.vm._264_8_ * 0x18);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_448,&local_449,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_448);
                                if (!bVar1) {
                                  testing::Message::Message(&local_458);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)local_480,(internal *)local_448,
                                             (AssertionResult *)
                                             "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                                             "false","true",in_R9);
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_460,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x197,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_460,&local_458);
                                  testing::internal::AssertHelper::~AssertHelper(&local_460);
                                  std::__cxx11::string::~string((string *)local_480);
                                  testing::Message::~Message(&local_458);
                                }
                                gtest_ar.message_.ptr_._5_3_ = 0;
                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_448);
                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                  gtest_ar_11.message_.ptr_._4_4_ =
                                       MockParser::next((MockParser *)&gtest_ar_.message_);
                                  local_49c = bc_op(gtest_ar_11.message_.ptr_._4_4_);
                                  local_4a0 = BC_NEQ_LN;
                                  testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                            ((EqHelper<false> *)local_498,"bc_op(ins)","BC_NEQ_LN",
                                             &local_49c,&local_4a0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_498);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_4a8);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_498);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x197,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_12.message_,&local_4a8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_);
                                    testing::Message::~Message(&local_4a8);
                                  }
                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_498);
                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                    local_4c1 = bc_arg1(gtest_ar_11.message_.ptr_._4_4_);
                                    local_4c8 = 1;
                                    testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                              ((EqHelper<false> *)local_4c0,"bc_arg1(ins)","1",
                                               &local_4c1,&local_4c8);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4c0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4d0);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4c0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x197,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_13.message_,&local_4d0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_13.message_);
                                      testing::Message::~Message(&local_4d0);
                                    }
                                    gtest_ar.message_.ptr_._5_3_ = 0;
                                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4c0);
                                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                      local_4ea = bc_arg16(gtest_ar_11.message_.ptr_._4_4_);
                                      local_4f0 = 1;
                                      testing::internal::EqHelper<false>::
                                      Compare<unsigned_short,int>
                                                ((EqHelper<false> *)local_4e8,"bc_arg16(ins)","1",
                                                 &local_4ea,&local_4f0);
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4e8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4f8);
                                        pcVar2 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_4e8);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar__5.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x197,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar__5.message_,&local_4f8)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar__5.message_);
                                        testing::Message::~Message(&local_4f8);
                                      }
                                      gtest_ar.message_.ptr_._5_3_ = 0;
                                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4e8);
                                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                        local_511 = mock.cur_fn <
                                                    (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                         mock.vm._264_8_ * 0x18);
                                        testing::AssertionResult::AssertionResult<bool>
                                                  ((AssertionResult *)local_510,&local_511,
                                                   (type *)0x0);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_510);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_520);
                                          testing::internal::
                                          GetBoolAssertionFailureMessage_abi_cxx11_
                                                    ((string *)local_548,(internal *)local_510,
                                                     (AssertionResult *)
                                                                                                          
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                          pcVar2 = (char *)std::__cxx11::string::c_str();
                                          testing::internal::AssertHelper::AssertHelper
                                                    (&local_528,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x198,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    (&local_528,&local_520);
                                          testing::internal::AssertHelper::~AssertHelper(&local_528)
                                          ;
                                          std::__cxx11::string::~string((string *)local_548);
                                          testing::Message::~Message(&local_520);
                                        }
                                        gtest_ar.message_.ptr_._5_3_ = 0;
                                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_510);
                                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                          gtest_ar_14.message_.ptr_._4_4_ =
                                               MockParser::next((MockParser *)&gtest_ar_.message_);
                                          local_564 = bc_op(gtest_ar_14.message_.ptr_._4_4_);
                                          local_568 = BC_JMP;
                                          testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                                    ((EqHelper<false> *)local_560,"bc_op(ins)",
                                                     "BC_JMP",&local_564,&local_568);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_560);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_570);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_560);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_15.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x198,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_15.message_,
                                                       &local_570);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_15.message_);
                                            testing::Message::~Message(&local_570);
                                          }
                                          gtest_ar.message_.ptr_._5_3_ = 0;
                                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_560);
                                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                            local_58c = bc_arg24(gtest_ar_14.message_.ptr_._4_4_);
                                            local_590 = 0x800002;
                                            testing::internal::EqHelper<false>::
                                            Compare<unsigned_int,int>
                                                      ((EqHelper<false> *)local_588,"bc_arg24(ins)",
                                                       "0x800000 + 3 - 1",&local_58c,&local_590);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_588);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_598);
                                              pcVar2 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_588);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar__6.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x198,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar__6.message_,
                                                         &local_598);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar__6.message_);
                                              testing::Message::~Message(&local_598);
                                            }
                                            gtest_ar.message_.ptr_._5_3_ = 0;
                                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_588);
                                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                              local_5b1 = mock.cur_fn <
                                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10
                                                                               + mock.vm._264_8_ *
                                                                                 0x18);
                                              testing::AssertionResult::AssertionResult<bool>
                                                        ((AssertionResult *)local_5b0,&local_5b1,
                                                         (type *)0x0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_5b0);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_5c0);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)local_5e8,(internal *)local_5b0
                                                           ,(AssertionResult *)
                                                                                                                        
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_5c8,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x199,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_5c8,&local_5c0);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_5c8);
                                                std::__cxx11::string::~string((string *)local_5e8);
                                                testing::Message::~Message(&local_5c0);
                                              }
                                              gtest_ar.message_.ptr_._5_3_ = 0;
                                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_5b0);
                                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                gtest_ar_16.message_.ptr_._4_4_ =
                                                     MockParser::next((MockParser *)
                                                                      &gtest_ar_.message_);
                                                local_604 = bc_op(gtest_ar_16.message_.ptr_._4_4_);
                                                local_608 = BC_SET_P;
                                                testing::internal::EqHelper<false>::
                                                Compare<BcOp,BcOp>((EqHelper<false> *)local_600,
                                                                   "bc_op(ins)","BC_SET_P",
                                                                   &local_604,&local_608);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_600);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_610);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_600);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_17.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x199,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_17.message_,
                                                             &local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_17.message_);
                                                  testing::Message::~Message(&local_610);
                                                }
                                                gtest_ar.message_.ptr_._5_3_ = 0;
                                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_600);
                                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                  local_629 = bc_arg1(gtest_ar_16.message_.ptr_.
                                                                      _4_4_);
                                                  local_630 = 2;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<unsigned_char,int>
                                                            ((EqHelper<false> *)local_628,
                                                             "bc_arg1(ins)","2",&local_629,
                                                             &local_630);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_628);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_638);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_628);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_18.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x199,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_18.message_,
                                                             &local_638);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_18.message_);
                                                  testing::Message::~Message(&local_638);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_628);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_652 = bc_arg16(gtest_ar_16.message_.ptr_.
                                                                         _4_4_);
                                                    local_658 = PRIM_TRUE;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,Primitive>
                                                              ((EqHelper<false> *)local_650,
                                                               "bc_arg16(ins)","PRIM_TRUE",
                                                               &local_652,&local_658);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_650)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_660);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_650);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__7.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x199,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__7.message_,
                                                             &local_660);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__7.message_);
                                                  testing::Message::~Message(&local_660);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_650);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_679 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_678,&local_679
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_678);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_688);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_6b0,
                                                               (internal *)local_678,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_690,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_690,&local_688);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_690);
                                                  std::__cxx11::string::~string((string *)local_6b0)
                                                  ;
                                                  testing::Message::~Message(&local_688);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_678);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_19.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_6cc = bc_op(gtest_ar_19.message_.ptr_.
                                                                      _4_4_);
                                                    local_6d0 = BC_JMP;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_6c8,
                                                                       "bc_op(ins)","BC_JMP",
                                                                       &local_6cc,&local_6d0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6c8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6d8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_20.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_20.message_,
                                                             &local_6d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_20.message_);
                                                  testing::Message::~Message(&local_6d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6f4 = bc_arg24(gtest_ar_19.message_.ptr_.
                                                                         _4_4_);
                                                    local_6f8 = 0x800001;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_int,int>
                                                              ((EqHelper<false> *)local_6f0,
                                                               "bc_arg24(ins)","0x800000 + 2 - 1",
                                                               &local_6f4,&local_6f8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6f0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_700);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__8.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19a,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__8.message_,
                                                             &local_700);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__8.message_);
                                                  testing::Message::~Message(&local_700);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_719 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_718,&local_719
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_718);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_728);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_750,
                                                               (internal *)local_718,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_730,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_730,&local_728);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_730);
                                                  std::__cxx11::string::~string((string *)local_750)
                                                  ;
                                                  testing::Message::~Message(&local_728);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_718);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_21.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_76c = bc_op(gtest_ar_21.message_.ptr_.
                                                                      _4_4_);
                                                    local_770 = BC_SET_P;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_768,
                                                                       "bc_op(ins)","BC_SET_P",
                                                                       &local_76c,&local_770);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_768)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_778);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_768);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_22.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_22.message_,
                                                             &local_778);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_22.message_);
                                                  testing::Message::~Message(&local_778);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_768);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_791 = bc_arg1(gtest_ar_21.message_.ptr_.
                                                                        _4_4_);
                                                    local_798 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_790,
                                                               "bc_arg1(ins)","2",&local_791,
                                                               &local_798);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_790)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7a0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_790);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_23.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             &local_7a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_7a0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_790);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7ba = bc_arg16(gtest_ar_21.message_.ptr_.
                                                                         _4_4_);
                                                    local_7c0 = PRIM_FALSE;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,Primitive>
                                                              ((EqHelper<false> *)local_7b8,
                                                               "bc_arg16(ins)","PRIM_FALSE",
                                                               &local_7ba,&local_7c0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7b8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7c8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_7b8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__9.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__9.message_,
                                                             &local_7c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__9.message_);
                                                  testing::Message::~Message(&local_7c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7b8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7e1 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_7e0,&local_7e1
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7f0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_818,
                                                               (internal *)local_7e0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_7f8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7f8,&local_7f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7f8);
                                                  std::__cxx11::string::~string((string *)local_818)
                                                  ;
                                                  testing::Message::~Message(&local_7f0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_24.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_834 = bc_op(gtest_ar_24.message_.ptr_.
                                                                      _4_4_);
                                                    local_838 = BC_NEQ_LN;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_830,
                                                                       "bc_op(ins)","BC_NEQ_LN",
                                                                       &local_834,&local_838);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_830)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_840);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_830);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_25.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_840);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_840);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_830);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_859 = bc_arg1(gtest_ar_24.message_.ptr_.
                                                                        _4_4_);
                                                    local_860 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_858,
                                                               "bc_arg1(ins)","0",&local_859,
                                                               &local_860);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_858)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_868);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_858);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_26.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_26.message_,
                                                             &local_868);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_26.message_);
                                                  testing::Message::~Message(&local_868);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_858);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_882 = bc_arg16(gtest_ar_24.message_.ptr_.
                                                                         _4_4_);
                                                    local_888 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,int>
                                                              ((EqHelper<false> *)local_880,
                                                               "bc_arg16(ins)","0",&local_882,
                                                               &local_888);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_880)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_890);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_880);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__10.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__10.message_,
                                                             &local_890);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__10.message_)
                                                  ;
                                                  testing::Message::~Message(&local_890);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_880);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_8a9 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_8a8,&local_8a9
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_8a8);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_8b8);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_8e0,
                                                               (internal *)local_8a8,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_8c0,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_8c0,&local_8b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_8c0);
                                                  std::__cxx11::string::~string((string *)local_8e0)
                                                  ;
                                                  testing::Message::~Message(&local_8b8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8a8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_27.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_8fc = bc_op(gtest_ar_27.message_.ptr_.
                                                                      _4_4_);
                                                    local_900 = BC_JMP;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_8f8,
                                                                       "bc_op(ins)","BC_JMP",
                                                                       &local_8fc,&local_900);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8f8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_908);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_8f8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_28.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_28.message_,
                                                             &local_908);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_28.message_);
                                                  testing::Message::~Message(&local_908);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8f8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_924 = bc_arg24(gtest_ar_27.message_.ptr_.
                                                                         _4_4_);
                                                    local_928 = 0x800006;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_int,int>
                                                              ((EqHelper<false> *)local_920,
                                                               "bc_arg24(ins)","0x800000 + 7 - 1",
                                                               &local_924,&local_928);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_920)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_930);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_920);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__11.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19e,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__11.message_,
                                                             &local_930);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__11.message_)
                                                  ;
                                                  testing::Message::~Message(&local_930);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_920);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_949 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_948,&local_949
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_948);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_958);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_980,
                                                               (internal *)local_948,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_960,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_960,&local_958);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_960);
                                                  std::__cxx11::string::~string((string *)local_980)
                                                  ;
                                                  testing::Message::~Message(&local_958);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_948);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_29.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_99c = bc_op(gtest_ar_29.message_.ptr_.
                                                                      _4_4_);
                                                    local_9a0 = BC_NEQ_LN;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_998,
                                                                       "bc_op(ins)","BC_NEQ_LN",
                                                                       &local_99c,&local_9a0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_998)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9a8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_998);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_30.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_30.message_,
                                                             &local_9a8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_30.message_);
                                                  testing::Message::~Message(&local_9a8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_998);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_9c1 = bc_arg1(gtest_ar_29.message_.ptr_.
                                                                        _4_4_);
                                                    local_9c8 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_9c0,
                                                               "bc_arg1(ins)","1",&local_9c1,
                                                               &local_9c8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9c0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9d0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_9c0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_31.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_31.message_,
                                                             &local_9d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_31.message_);
                                                  testing::Message::~Message(&local_9d0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9c0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_9ea = bc_arg16(gtest_ar_29.message_.ptr_.
                                                                         _4_4_);
                                                    local_9f0 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,int>
                                                              ((EqHelper<false> *)local_9e8,
                                                               "bc_arg16(ins)","1",&local_9ea,
                                                               &local_9f0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9e8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_9f8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_9e8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__12.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x19f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__12.message_,
                                                             &local_9f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__12.message_)
                                                  ;
                                                  testing::Message::~Message(&local_9f8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9e8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a11 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_a10,&local_a11
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_a10);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_a20);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_a48,
                                                               (internal *)local_a10,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_a28,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a0,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_a28,&local_a20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_a28);
                                                  std::__cxx11::string::~string((string *)local_a48)
                                                  ;
                                                  testing::Message::~Message(&local_a20);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a10);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_32.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_a64 = bc_op(gtest_ar_32.message_.ptr_.
                                                                      _4_4_);
                                                    local_a68 = BC_JMP;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_a60,
                                                                       "bc_op(ins)","BC_JMP",
                                                                       &local_a64,&local_a68);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a60)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a70);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a60);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_33.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a0,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_33.message_,
                                                             &local_a70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_33.message_);
                                                  testing::Message::~Message(&local_a70);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a60);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_a8c = bc_arg24(gtest_ar_32.message_.ptr_.
                                                                         _4_4_);
                                                    local_a90 = 0x800004;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_int,int>
                                                              ((EqHelper<false> *)local_a88,
                                                               "bc_arg24(ins)","0x800000 + 5 - 1",
                                                               &local_a8c,&local_a90);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_a88)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_a98);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_a88);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__13.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a0,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__13.message_,
                                                             &local_a98);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__13.message_)
                                                  ;
                                                  testing::Message::~Message(&local_a98);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a88);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ab1 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_ab0,&local_ab1
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ab0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_ac0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_ae8,
                                                               (internal *)local_ab0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_ac8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ac8,&local_ac0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ac8);
                                                  std::__cxx11::string::~string((string *)local_ae8)
                                                  ;
                                                  testing::Message::~Message(&local_ac0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ab0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_34.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_b04 = bc_op(gtest_ar_34.message_.ptr_.
                                                                      _4_4_);
                                                    local_b08 = BC_NEQ_LN;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_b00,
                                                                       "bc_op(ins)","BC_NEQ_LN",
                                                                       &local_b04,&local_b08);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b00)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b10);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_b00);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_35.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_35.message_,
                                                             &local_b10);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_35.message_);
                                                  testing::Message::~Message(&local_b10);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b00);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_b29 = bc_arg1(gtest_ar_34.message_.ptr_.
                                                                        _4_4_);
                                                    local_b30 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_b28,
                                                               "bc_arg1(ins)","2",&local_b29,
                                                               &local_b30);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b28)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b38);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_b28);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_36.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_36.message_,
                                                             &local_b38);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_36.message_);
                                                  testing::Message::~Message(&local_b38);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b28);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_b52 = bc_arg16(gtest_ar_34.message_.ptr_.
                                                                         _4_4_);
                                                    local_b58 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,int>
                                                              ((EqHelper<false> *)local_b50,
                                                               "bc_arg16(ins)","2",&local_b52,
                                                               &local_b58);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_b50)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_b60);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_b50);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__14.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__14.message_,
                                                             &local_b60);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__14.message_)
                                                  ;
                                                  testing::Message::~Message(&local_b60);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b50);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_b79 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_b78,&local_b79
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b78);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_b88);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_bb0,
                                                               (internal *)local_b78,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_b90,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_b90,&local_b88);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_b90);
                                                  std::__cxx11::string::~string((string *)local_bb0)
                                                  ;
                                                  testing::Message::~Message(&local_b88);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b78);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_37.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_bcc = bc_op(gtest_ar_37.message_.ptr_.
                                                                      _4_4_);
                                                    local_bd0 = BC_JMP;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_bc8,
                                                                       "bc_op(ins)","BC_JMP",
                                                                       &local_bcc,&local_bd0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_bc8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_bd8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_bc8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_38.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_38.message_,
                                                             &local_bd8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_38.message_);
                                                  testing::Message::~Message(&local_bd8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_bc8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_bf4 = bc_arg24(gtest_ar_37.message_.ptr_.
                                                                         _4_4_);
                                                    local_bf8 = 0x800002;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_int,int>
                                                              ((EqHelper<false> *)local_bf0,
                                                               "bc_arg24(ins)","0x800000 + 3 - 1",
                                                               &local_bf4,&local_bf8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_bf0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c00);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_bf0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__15.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a2,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__15.message_,
                                                             &local_c00);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__15.message_)
                                                  ;
                                                  testing::Message::~Message(&local_c00);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_bf0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c19 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_c18,&local_c19
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c18);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_c28);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_c50,
                                                               (internal *)local_c18,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_c30,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c30,&local_c28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c30);
                                                  std::__cxx11::string::~string((string *)local_c50)
                                                  ;
                                                  testing::Message::~Message(&local_c28);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c18);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_39.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_c6c = bc_op(gtest_ar_39.message_.ptr_.
                                                                      _4_4_);
                                                    local_c70 = BC_SET_P;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_c68,
                                                                       "bc_op(ins)","BC_SET_P",
                                                                       &local_c6c,&local_c70);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c68)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_c78);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c68);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_40.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_40.message_,
                                                             &local_c78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_40.message_);
                                                  testing::Message::~Message(&local_c78);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c68);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_c91 = bc_arg1(gtest_ar_39.message_.ptr_.
                                                                        _4_4_);
                                                    local_c98 = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_c90,
                                                               "bc_arg1(ins)","3",&local_c91,
                                                               &local_c98);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_c90)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ca0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_c90);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_41.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_41.message_,
                                                             &local_ca0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_41.message_);
                                                  testing::Message::~Message(&local_ca0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c90);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_cba = bc_arg16(gtest_ar_39.message_.ptr_.
                                                                         _4_4_);
                                                    local_cc0 = PRIM_TRUE;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,Primitive>
                                                              ((EqHelper<false> *)local_cb8,
                                                               "bc_arg16(ins)","PRIM_TRUE",
                                                               &local_cba,&local_cc0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_cb8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_cc8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_cb8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__16.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a3,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__16.message_,
                                                             &local_cc8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__16.message_)
                                                  ;
                                                  testing::Message::~Message(&local_cc8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_cb8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ce1 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_ce0,&local_ce1
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ce0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_cf0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_d18,
                                                               (internal *)local_ce0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_cf8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_cf8,&local_cf0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_cf8);
                                                  std::__cxx11::string::~string((string *)local_d18)
                                                  ;
                                                  testing::Message::~Message(&local_cf0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ce0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_42.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_d34 = bc_op(gtest_ar_42.message_.ptr_.
                                                                      _4_4_);
                                                    local_d38 = BC_JMP;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_d30,
                                                                       "bc_op(ins)","BC_JMP",
                                                                       &local_d34,&local_d38);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d30)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d40);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d30);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_43.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_43.message_,
                                                             &local_d40);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_43.message_);
                                                  testing::Message::~Message(&local_d40);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d30);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d5c = bc_arg24(gtest_ar_42.message_.ptr_.
                                                                         _4_4_);
                                                    local_d60 = 0x800001;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_int,int>
                                                              ((EqHelper<false> *)local_d58,
                                                               "bc_arg24(ins)","0x800000 + 2 - 1",
                                                               &local_d5c,&local_d60);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_d58)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_d68);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_d58);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__17.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a4,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__17.message_,
                                                             &local_d68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__17.message_)
                                                  ;
                                                  testing::Message::~Message(&local_d68);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d58);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_d81 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_d80,&local_d81
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_d80);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_d90);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_db8,
                                                               (internal *)local_d80,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_d98,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_d98,&local_d90);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_d98);
                                                  std::__cxx11::string::~string((string *)local_db8)
                                                  ;
                                                  testing::Message::~Message(&local_d90);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d80);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_44.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_dd4 = bc_op(gtest_ar_44.message_.ptr_.
                                                                      _4_4_);
                                                    local_dd8 = BC_SET_P;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_dd0,
                                                                       "bc_op(ins)","BC_SET_P",
                                                                       &local_dd4,&local_dd8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_dd0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_de0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_dd0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_45.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_45.message_,
                                                             &local_de0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_45.message_);
                                                  testing::Message::~Message(&local_de0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_dd0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_df9 = bc_arg1(gtest_ar_44.message_.ptr_.
                                                                        _4_4_);
                                                    local_e00 = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_df8,
                                                               "bc_arg1(ins)","3",&local_df9,
                                                               &local_e00);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_df8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_e08);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_df8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_46.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_46.message_,
                                                             &local_e08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_46.message_);
                                                  testing::Message::~Message(&local_e08);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_df8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_e22 = bc_arg16(gtest_ar_44.message_.ptr_.
                                                                         _4_4_);
                                                    local_e28 = PRIM_FALSE;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,Primitive>
                                                              ((EqHelper<false> *)local_e20,
                                                               "bc_arg16(ins)","PRIM_FALSE",
                                                               &local_e22,&local_e28);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e20)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_e30);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_e20);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__18.message_,
                                                                 kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a5,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__18.message_,
                                                             &local_e30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__18.message_)
                                                  ;
                                                  testing::Message::~Message(&local_e30);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e20);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_e49 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_e48,&local_e49
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_e48);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_e58);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_e80,
                                                               (internal *)local_e48,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_e60,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e60,&local_e58);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e60);
                                                  std::__cxx11::string::~string((string *)local_e80)
                                                  ;
                                                  testing::Message::~Message(&local_e58);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e48);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_47.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_e9c = bc_op(gtest_ar_47.message_.ptr_.
                                                                      _4_4_);
                                                    local_ea0 = BC_RET;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_e98,
                                                                       "bc_op(ins)","BC_RET",
                                                                       &local_e9c,&local_ea0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_e98)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ea8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_e98);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_48.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_48.message_,
                                                             &local_ea8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_48.message_);
                                                  testing::Message::~Message(&local_ea8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e98);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ec1 = bc_arg1(gtest_ar_47.message_.ptr_.
                                                                        _4_4_);
                                                    local_ec8 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_ec0,
                                                               "bc_arg1(ins)","0",&local_ec1,
                                                               &local_ec8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ec0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ed0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ec0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_49.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             &local_ed0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_);
                                                  testing::Message::~Message(&local_ed0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ec0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_ee9 = bc_arg2(gtest_ar_47.message_.ptr_.
                                                                        _4_4_);
                                                    local_ef0 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_ee8,
                                                               "bc_arg2(ins)","0",&local_ee9,
                                                               &local_ef0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_ee8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_ef8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_ee8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_50.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             &local_ef8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_);
                                                  testing::Message::~Message(&local_ef8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ee8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_f11 = bc_arg3(gtest_ar_47.message_.ptr_.
                                                                        _4_4_);
                                                    local_f18 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_f10,
                                                               "bc_arg3(ins)","0",&local_f11,
                                                               &local_f18);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_f10)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_f20);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_f10);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_f28,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x1a7,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_f28,&local_f20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_f28);
                                                  testing::Message::~Message(&local_f20);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f10);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar.message_.ptr_._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MockParser::~MockParser((MockParser *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Logic, And) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = a == 3 && b == 4\n"
		"let d = a == 3 && b == 4 && c == 5\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);

	INS2(BC_NEQ_LN, 0, 0);
	JMP(5);
	INS2(BC_NEQ_LN, 1, 1);
	JMP(3);
	INS2(BC_SET_P, 2, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 2, PRIM_FALSE);

	INS2(BC_NEQ_LN, 0, 0);
	JMP(7);
	INS2(BC_NEQ_LN, 1, 1);
	JMP(5);
	INS2(BC_NEQ_LN, 2, 2);
	JMP(3);
	INS2(BC_SET_P, 3, PRIM_TRUE);
	JMP(2);
	INS2(BC_SET_P, 3, PRIM_FALSE);

	INS(BC_RET, 0, 0, 0);
}